

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

Layout * __thiscall ear::Layout::withoutLfe(Layout *__return_storage_ptr__,Layout *this)

{
  storage_type *this_00;
  pointer pcVar1;
  pointer pCVar2;
  pointer __x;
  bool bVar3;
  long *local_118 [2];
  long local_108 [2];
  string local_f8;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_d8;
  optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_c0;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_88;
  variant<ear::PolarScreen,_ear::CartesianScreen> local_50;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  local_d8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultScreen();
  this_00 = &local_88.super_type.m_storage;
  local_88.super_type.m_initialized = false;
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
            ((variant<ear::PolarScreen,_ear::CartesianScreen> *)this_00,&local_50);
  local_88.super_type.m_initialized = true;
  Layout(__return_storage_ptr__,&local_f8,&local_d8,&local_88);
  if (local_88.super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)this_00);
    local_88.super_type.m_initialized = false;
  }
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content(&local_50);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (this->_name)._M_dataplus._M_p;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,pcVar1,pcVar1 + (this->_name)._M_string_length);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  local_c0.m_initialized = false;
  bVar3 = (this->_screen).super_type.m_initialized == true;
  if (bVar3) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)&local_c0.m_storage,
               (variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &(this->_screen).super_type.m_storage);
  }
  local_c0.m_initialized = bVar3;
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  assign(&(__return_storage_ptr__->_screen).super_type,&local_c0);
  if (local_c0.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)&local_c0.m_storage);
    local_c0.m_initialized = false;
  }
  __x = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar2 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (__x != pCVar2) {
    do {
      if (__x->_isLfe == false) {
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back
                  (&__return_storage_ptr__->_channels,__x);
      }
      __x = __x + 1;
    } while (__x != pCVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Layout Layout::withoutLfe() const {
    Layout layoutWithoutLfe;
    layoutWithoutLfe.name(_name);
    layoutWithoutLfe.screen(_screen);
    std::copy_if(_channels.begin(), _channels.end(),
                 back_inserter(layoutWithoutLfe.channels()),
                 [](const Channel& c) { return !c.isLfe(); });
    return layoutWithoutLfe;
  }